

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  MemPage *pMVar6;
  char cVar7;
  
  *pRes = 0;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (pCur->eState == '\x01') {
    cVar7 = pCur->iPage;
    if ((pCur->aiIdx[cVar7] != 0) && (pCur->apPage[cVar7]->leaf != '\0')) {
      pCur->aiIdx[cVar7] = pCur->aiIdx[cVar7] - 1;
      return 0;
    }
  }
  bVar3 = pCur->eState;
  if (bVar3 != 1) {
    if (2 < bVar3) {
      iVar4 = btreeRestoreCursorPosition(pCur);
      if (iVar4 != 0) {
        return iVar4;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 0) {
LAB_0013934b:
      *pRes = 1;
      return 0;
    }
    iVar4 = pCur->skipNext;
    if (iVar4 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar4 < 0) {
        return 0;
      }
    }
  }
  cVar7 = pCur->iPage;
  lVar5 = (long)cVar7;
  pMVar6 = pCur->apPage[lVar5];
  uVar1 = pCur->aiIdx[lVar5];
  if (pMVar6->leaf == '\0') {
    uVar2 = *(uint *)(pMVar6->aData +
                     (CONCAT11(pMVar6->aCellIdx[(ulong)uVar1 * 2],
                               pMVar6->aCellIdx[(ulong)uVar1 * 2 + 1]) & pMVar6->maskPage));
    iVar4 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
    if (iVar4 == 0) {
      iVar4 = moveToRightmost(pCur);
      return iVar4;
    }
  }
  else {
    if (uVar1 == 0) {
      do {
        if (cVar7 == '\0') {
          pCur->eState = '\0';
          goto LAB_0013934b;
        }
        (pCur->info).nSize = 0;
        pCur->curFlags = pCur->curFlags & 0xf9;
        pCur->iPage = cVar7 + -1;
        sqlite3PagerUnrefNotNull(pCur->apPage[lVar5]->pDbPage);
        cVar7 = pCur->iPage;
        lVar5 = (long)cVar7;
        uVar1 = pCur->aiIdx[lVar5];
      } while (uVar1 == 0);
      pMVar6 = pCur->apPage[lVar5];
    }
    pCur->aiIdx[lVar5] = uVar1 - 1;
    iVar4 = 0;
    if ((pMVar6->intKey != '\0') && (pMVar6->leaf == '\0')) {
      iVar4 = sqlite3BtreePrevious(pCur,pRes);
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  *pRes = 0;
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->aiIdx[pCur->iPage]==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur, pRes);
  }
  pCur->aiIdx[pCur->iPage]--;
  return SQLITE_OK;
}